

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_calc_mb_wiener_var_mt
               (AV1_COMP *cpi,int num_workers,double *sum_rec_distortion,double *sum_est_rate)

{
  uint uVar1;
  AV1_COMMON *cm;
  ThreadData_conflict *__src;
  EncWorkerData *pEVar2;
  int rows;
  AV1_PRIMARY *pAVar3;
  AVxWorker *pAVar4;
  EncWorkerData *pEVar5;
  ThreadData_conflict *pTVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  cm = &cpi->common;
  pAVar3 = cpi->ppi;
  rows = (cpi->common).mi_params.mi_rows;
  row_mt_sync_mem_alloc(&pAVar3->intra_row_mt_sync,cm,rows);
  (pAVar3->intra_row_mt_sync).intrabc_extra_top_right_sb_delay = 0;
  (pAVar3->intra_row_mt_sync).num_threads_working = num_workers;
  (pAVar3->intra_row_mt_sync).next_mi_row = 0;
  memset((pAVar3->intra_row_mt_sync).num_finished_cols,0xff,(long)rows << 2);
  (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit = false;
  __src = &cpi->td;
  uVar7 = num_workers;
  while (0 < (int)uVar7) {
    uVar1 = uVar7 - 1;
    pAVar4 = (cpi->mt_info).workers;
    pEVar5 = (cpi->mt_info).tile_thr_data;
    pEVar2 = pEVar5 + uVar1;
    pAVar4[uVar1].hook = cal_mb_wiener_var_hook;
    pAVar4[uVar1].data1 = pEVar2;
    pAVar4[uVar1].data2 = (void *)0x0;
    pEVar5[uVar1].thread_id = uVar7 - 1;
    pEVar5[uVar1].start = 0;
    pEVar5[uVar1].cpi = cpi;
    if (uVar7 == 1) {
      pEVar2->td = __src;
      uVar7 = uVar1;
    }
    else {
      pTVar6 = pEVar2->original_td;
      pEVar2->td = pTVar6;
      uVar7 = uVar1;
      if (pTVar6 != __src) {
        memcpy(pTVar6,__src,0x256b0);
        av1_alloc_mb_wiener_var_pred_buf(cm,pEVar2->td);
      }
    }
  }
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,cm,num_workers);
  av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
  uVar8 = 0;
  uVar9 = (ulong)(uint)num_workers;
  if (num_workers < 1) {
    uVar9 = uVar8;
  }
  for (; uVar9 * 0x1d0 - uVar8 != 0; uVar8 = uVar8 + 0x1d0) {
    pTVar6 = *(ThreadData_conflict **)
              ((((cpi->mt_info).tile_thr_data)->error_info).detail + (uVar8 - 0x18));
    if (pTVar6 != __src) {
      av1_dealloc_mb_wiener_var_pred_buf(pTVar6);
    }
  }
  return;
}

Assistant:

void av1_calc_mb_wiener_var_mt(AV1_COMP *cpi, int num_workers,
                               double *sum_rec_distortion,
                               double *sum_est_rate) {
  (void)sum_rec_distortion;
  (void)sum_est_rate;
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;

  // TODO(chengchen): the memory usage could be improved.
  const int mi_rows = cm->mi_params.mi_rows;
  row_mt_sync_mem_alloc(intra_row_mt_sync, cm, mi_rows);

  intra_row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
  intra_row_mt_sync->num_threads_working = num_workers;
  intra_row_mt_sync->next_mi_row = 0;
  memset(intra_row_mt_sync->num_finished_cols, -1,
         sizeof(*intra_row_mt_sync->num_finished_cols) * mi_rows);
  mt_info->enc_row_mt.mb_wiener_mt_exit = false;

  prepare_wiener_var_workers(cpi, cal_mb_wiener_var_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  dealloc_mb_wiener_var_mt_data(cpi, num_workers);
}